

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_dr_flac *
ma_dr_flac_open_file_with_metadata
          (char *pFileName,ma_dr_flac_meta_proc onMeta,void *pUserData,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_dr_flac *pmVar2;
  FILE *pFile;
  
  mVar1 = ma_fopen(&pFile,pFileName,"rb");
  if (mVar1 == MA_SUCCESS) {
    pmVar2 = ma_dr_flac_open_with_metadata_private
                       (ma_dr_flac__on_read_stdio,ma_dr_flac__on_seek_stdio,onMeta,
                        ma_dr_flac_container_unknown,pFile,pUserData,pAllocationCallbacks);
    if (pmVar2 != (ma_dr_flac *)0x0) {
      return pmVar2;
    }
    fclose((FILE *)pFile);
  }
  return (ma_dr_flac *)0x0;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_file_with_metadata(const char* pFileName, ma_dr_flac_meta_proc onMeta, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    FILE* pFile;
    if (ma_fopen(&pFile, pFileName, "rb") != MA_SUCCESS) {
        return NULL;
    }
    pFlac = ma_dr_flac_open_with_metadata_private(ma_dr_flac__on_read_stdio, ma_dr_flac__on_seek_stdio, onMeta, ma_dr_flac_container_unknown, (void*)pFile, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        fclose(pFile);
        return pFlac;
    }
    return pFlac;
}